

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

DdNode * Llb_Nonlin4Image(DdManager *dd,Vec_Ptr_t *vParts,DdNode *bCurrent,Vec_Int_t *vVars2Q)

{
  Llb_Prt_t *pPart;
  int iVar1;
  int iVar2;
  Llb_Mgr_t_conflict *p;
  long lVar3;
  DdNode *n;
  long lVar4;
  DdNode *f;
  long lVar5;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_38;
  Llb_Prt_t *local_30;
  
  p = Llb_Nonlin4Alloc(dd,vParts,bCurrent,vVars2Q,0);
  if (0 < p->iPartFree) {
    lVar5 = 0;
    do {
      pPart = p->pParts[lVar5];
      if (pPart != (Llb_Prt_t *)0x0) {
        lVar3 = (long)pPart->vVars->nSize;
        if (0 < lVar3) {
          lVar4 = 0;
          do {
            if (p->pVars[pPart->vVars->pArray[lVar4]]->vParts->nSize == 1) {
              Llb_Nonlin4Quantify1(p,pPart);
              break;
            }
            lVar4 = lVar4 + 1;
          } while (lVar3 != lVar4);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->iPartFree);
  }
  Llb_Nonlin4RecomputeScores(p);
  iVar1 = Llb_Nonlin4NextPartitions(p,&local_30,&local_38);
  if (iVar1 != 0) {
    do {
      iVar1 = Cudd_ReadReorderings(dd);
      iVar2 = Llb_Nonlin4Quantify2(p,local_30,local_38);
      if (iVar2 == 0) {
        Llb_Nonlin4Free(p);
        return (DdNode *)0x0;
      }
      iVar2 = Cudd_ReadReorderings(dd);
      if (iVar1 < iVar2) {
        Llb_Nonlin4RecomputeScores(p);
      }
      iVar1 = Llb_Nonlin4NextPartitions(p,&local_30,&local_38);
    } while (iVar1 != 0);
  }
  n = Cudd_ReadOne(p->dd);
  Cudd_Ref(n);
  if (0 < p->iPartFree) {
    lVar5 = 0;
    f = n;
    do {
      n = f;
      if (p->pParts[lVar5] != (Llb_Prt_t *)0x0) {
        n = Cudd_bddAnd(p->dd,f,p->pParts[lVar5]->bFunc);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,f);
      }
      lVar5 = lVar5 + 1;
      f = n;
    } while (lVar5 < p->iPartFree);
  }
  Llb_Nonlin4Free(p);
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Llb_Nonlin4Image( DdManager * dd, Vec_Ptr_t * vParts, DdNode * bCurrent, Vec_Int_t * vVars2Q )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders;
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, bCurrent, vVars2Q, 0 );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
//    nSuppMax = p->nSuppMax;
    Llb_Nonlin4Free( p );
//printf( "\n" );
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}